

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

void __thiscall Matrix<double>::swap(Matrix<double> *this,uint row1,uint row2)

{
  pointer pvVar1;
  vector<double,_std::allocator<double>_> mat_row;
  vector<double,_std::allocator<double>_> local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_38,
             (this->m_elems).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + row1);
  pvVar1 = (this->m_elems).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::operator=(pvVar1 + row1,pvVar1 + row2);
  std::vector<double,_std::allocator<double>_>::operator=
            ((this->m_elems).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + row2,&local_38);
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Matrix<T>::swap(unsigned row1, unsigned row2){
    std::vector<T> mat_row=m_elems[row1];
    m_elems[row1]=m_elems[row2];
    m_elems[row2]=mat_row;
}